

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void makeTokenMap(UDataSwapper *ds,int16_t *tokens,uint16_t tokenCount,uint8_t *map,
                 UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t c1;
  uint8_t c2;
  UBool usedOutChar [256];
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  if (ds->inCharset == ds->outCharset) {
    for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
      map[lVar3] = (uint8_t)lVar3;
    }
  }
  else {
    memset(map,0,0x100);
    memset(usedOutChar,0,0x100);
    uVar1 = 0x100;
    if (tokenCount < 0x100) {
      uVar1 = tokenCount;
    }
    for (uVar7 = 1; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      if (tokens[uVar7] == -1) {
        c1 = (uint8_t)uVar7;
        (*ds->swapInvChars)(ds,&c1,1,&c2,pErrorCode);
        if (U_ZERO_ERROR < *pErrorCode) {
          udata_printError_63(ds,
                              "unames/makeTokenMap() finds variant character 0x%02x used (input charset family %d)\n"
                              ,uVar7 & 0xffffffff,(ulong)ds->inCharset);
          return;
        }
        map[c1] = c2;
        usedOutChar[c2] = '\x01';
      }
    }
    uVar2 = 1;
    for (uVar7 = 1; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      if (map[uVar7] == '\0') {
        uVar5 = uVar2 - 1;
        do {
          uVar6 = uVar2 & 0xffff;
          uVar2 = uVar2 + 1;
          bVar4 = (char)uVar5 + 1;
          uVar5 = (uint)bVar4;
        } while (usedOutChar[uVar6] != '\0');
        map[uVar7] = bVar4;
      }
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }